

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

BBox * __thiscall CS248::DynamicScene::Mesh::getBBox(BBox *__return_storage_ptr__,Mesh *this)

{
  undefined8 uVar1;
  pointer pVVar2;
  long lVar3;
  int i;
  long lVar4;
  Vector4D local_f8;
  Vector4D posObjWorld;
  Vector3D local_b0 [5];
  
  BBox::BBox(__return_storage_ptr__);
  lVar3 = 8;
  for (lVar4 = 0; lVar4 < (long)this->numTriangles_ * 3; lVar4 = lVar4 + 1) {
    pVVar2 = (this->positionData_).
             super__Vector_base<CS248::DynamicScene::Vector3Df,_std::allocator<CS248::DynamicScene::Vector3Df>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_f8.z = (double)*(float *)((long)&pVVar2->x + lVar3);
    uVar1 = *(undefined8 *)((long)pVVar2 + lVar3 + -8);
    local_f8.x = (double)(float)uVar1;
    local_f8.y = (double)(float)((ulong)uVar1 >> 0x20);
    local_f8.w = 1.0;
    SceneObject::getObjectToWorld((Matrix4x4 *)local_b0,&this->super_SceneObject);
    Matrix4x4::operator*((Matrix4x4 *)local_b0,&local_f8);
    Vector4D::projectTo3D(&posObjWorld);
    BBox::expand(__return_storage_ptr__,local_b0);
    lVar3 = lVar3 + 0xc;
  }
  return __return_storage_ptr__;
}

Assistant:

BBox Mesh::getBBox() const {

	BBox bbox;

	// convert object-space points to world space points, and compute a world-space bounding box
	// NOTE(kayvonf): this is an inefficient implementation since we're considering each unique vertex position up to 3 times 
	for (int i=0; i<3*numTriangles_; ++i) {
		Vector4D posObj(positionData_[i].x, positionData_[i].y, positionData_[i].z, 1.f);
		Vector4D posObjWorld = getObjectToWorld() * posObj;
		bbox.expand(posObjWorld.projectTo3D());
  	}

  	return bbox;
}